

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O0

BindResult __thiscall
QOpenGLTextureCache::bindTexture
          (QOpenGLTextureCache *this,QOpenGLContext *context,qint64 key,QImage *image,
          BindOptions options)

{
  long lVar1;
  BindResult BVar2;
  qsizetype qVar3;
  QFlagsStorage<QOpenGLTextureUploader::BindOption> options_00;
  void *cost_00;
  undefined4 uVar4;
  undefined8 in_RCX;
  QOpenGLCachedTexture *in_RDI;
  long in_FS_OFFSET;
  QImage *in_stack_00000040;
  int cost;
  QOpenGLFunctions *funcs;
  GLuint id;
  QSize in_stack_00000184;
  BindOptions in_stack_0000018c;
  GLuint in_stack_ffffffffffffff58;
  GLenum in_stack_ffffffffffffff5c;
  BindResultFlag flags;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar5;
  GLuint id_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar6;
  unsigned_long_long *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  BindResultFlags BStack_c;
  
  id_00 = (GLuint)((ulong)in_RCX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::functions();
  uVar6 = 1;
  QOpenGLFunctions::glGenTextures
            ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,(GLuint *)0x19f9a7);
  uVar5 = 0xde1;
  QOpenGLFunctions::glBindTexture
            ((QOpenGLFunctions *)CONCAT44(0xde1,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
             ,in_stack_ffffffffffffff58);
  flags = (BindResultFlag)(in_stack_ffffffffffffff5c >> 0x18);
  QSize::QSize((QSize *)CONCAT44(uVar5,in_stack_ffffffffffffff60));
  qVar3 = QOpenGLTextureUploader::textureImage
                    (funcs._4_4_,in_stack_00000040,in_stack_0000018c,in_stack_00000184);
  uVar4 = (undefined4)qVar3;
  options_00.i = (Int)((ulong)&in_RDI[1].m_options >> 0x20);
  cost_00 = operator_new(0x10);
  QOpenGLCachedTexture::QOpenGLCachedTexture
            (in_RDI,id_00,(BindOptions)options_00.i,
             (QOpenGLContext *)CONCAT44(uVar5,in_stack_ffffffffffffff60));
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::insert
            ((QCache<unsigned_long_long,_QOpenGLCachedTexture> *)
             CONCAT44(uVar4,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
             (QOpenGLCachedTexture *)CONCAT44(uVar6,in_stack_ffffffffffffff88),(qsizetype)cost_00);
  QFlags<QOpenGLTextureCache::BindResultFlag>::QFlags
            ((QFlags<QOpenGLTextureCache::BindResultFlag> *)
             CONCAT44(uVar5,in_stack_ffffffffffffff60),flags);
  BVar2.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
  super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i =
       BStack_c.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
       super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i;
  BVar2.id = 0xaaaaaaaa;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return BVar2;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLTextureCache::BindResult QOpenGLTextureCache::bindTexture(QOpenGLContext *context,
                                                                 qint64 key,
                                                                 const QImage &image,
                                                                 QOpenGLTextureUploader::BindOptions options)
{
    Q_TRACE_SCOPE(QOpenGLTextureCache_bindTexture, context, key, image.bits(), options);

    GLuint id;
    QOpenGLFunctions *funcs = context->functions();
    funcs->glGenTextures(1, &id);
    funcs->glBindTexture(GL_TEXTURE_2D, id);

    int cost = QOpenGLTextureUploader::textureImage(GL_TEXTURE_2D, image, options);

    m_cache.insert(key, new QOpenGLCachedTexture(id, options, context), cost / 1024);

    return { id, BindResultFlag::NewTexture };
}